

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTransformUtil.h
# Opt level: O2

void btTransformUtil::calculateDiffAxisAngle
               (btTransform *transform0,btTransform *transform1,btVector3 *axis,btScalar *angle)

{
  btScalar bVar1;
  btQuaternion dorn;
  btMatrix3x3 dmat;
  float local_8c;
  btMatrix3x3 local_88;
  btMatrix3x3 local_58;
  
  btMatrix3x3::inverse(&transform0->m_basis);
  operator*(&local_58,&transform1->m_basis,&local_88);
  btMatrix3x3::getRotation(&local_58,(btQuaternion *)&local_88);
  btQuaternion::normalize((btQuaternion *)&local_88);
  bVar1 = btQuaternion::getAngle((btQuaternion *)&local_88);
  *angle = bVar1;
  *(undefined8 *)axis->m_floats = local_88.m_el[0].m_floats._0_8_;
  axis->m_floats[2] = local_88.m_el[0].m_floats[2];
  axis->m_floats[3] = 0.0;
  bVar1 = btVector3::length2(axis);
  if (1.4210855e-14 <= bVar1) {
    if (bVar1 < 0.0) {
      local_8c = sqrtf(bVar1);
    }
    else {
      local_8c = SQRT(bVar1);
    }
    btVector3::operator/=(axis,&local_8c);
  }
  else {
    axis->m_floats[0] = 1.0;
    axis->m_floats[1] = 0.0;
    axis->m_floats[2] = 0.0;
    axis->m_floats[3] = 0.0;
  }
  return;
}

Assistant:

static void calculateDiffAxisAngle(const btTransform& transform0,const btTransform& transform1,btVector3& axis,btScalar& angle)
	{
		btMatrix3x3 dmat = transform1.getBasis() * transform0.getBasis().inverse();
		btQuaternion dorn;
		dmat.getRotation(dorn);

		///floating point inaccuracy can lead to w component > 1..., which breaks 
		dorn.normalize();
		
		angle = dorn.getAngle();
		axis = btVector3(dorn.x(),dorn.y(),dorn.z());
		axis[3] = btScalar(0.);
		//check for axis length
		btScalar len = axis.length2();
		if (len < SIMD_EPSILON*SIMD_EPSILON)
			axis = btVector3(btScalar(1.),btScalar(0.),btScalar(0.));
		else
			axis /= btSqrt(len);
	}